

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O0

int descriptionToType(string *des)

{
  bool bVar1;
  string *des_local;
  
  bVar1 = std::operator==(des,"Alchitry Cu A");
  if (bVar1) {
    des_local._4_4_ = 2;
  }
  else {
    bVar1 = std::operator==(des,"Alchitry Au A");
    if (bVar1) {
      des_local._4_4_ = 0;
    }
    else {
      bVar1 = std::operator==(des,"Alchitry Au+ A");
      if (bVar1) {
        des_local._4_4_ = 1;
      }
      else {
        des_local._4_4_ = -1;
      }
    }
  }
  return des_local._4_4_;
}

Assistant:

int descriptionToType(const string &des) {
    if (des == "Alchitry Cu A") {
        return BOARD_CU;
    } else if (des == "Alchitry Au A") {
        return BOARD_AU;
    } else if (des == "Alchitry Au+ A") {
        return BOARD_AU_PLUS;
    } else {
        return BOARD_UNKNOWN;
    }
}